

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase_tests.cpp
# Opt level: O1

void __thiscall netbase_tests::isbadport::test_method(isbadport *this)

{
  readonly_property<bool> rVar1;
  bool bVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  uint16_t port;
  uint16_t port_00;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  size_t total_bad_ports;
  check_type cVar5;
  undefined4 local_21c;
  undefined1 local_218 [16];
  undefined1 *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  long local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined4 *local_b0;
  undefined **local_a8;
  element_type *local_a0;
  shared_count sStack_98;
  undefined4 **local_90;
  long *local_88;
  lazy_ostream local_80;
  undefined1 *local_70;
  long **local_68;
  char *local_60;
  char *local_58;
  assertion_result local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x256;
  file.m_begin = (iterator)&local_c0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d0,msg);
  rVar1.super_class_property<bool>.value = (class_property<bool>)IsBadPort(1);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_218._0_8_ = "IsBadPort(1)";
  local_218._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_d8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (long **)local_218;
  local_a8._0_1_ = rVar1.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_e0,0x256);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x257;
  file_00.m_begin = (iterator)&local_f0;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_100,
             msg_00);
  local_a8._0_1_ = (class_property<bool>)IsBadPort(0x16);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_218._0_8_ = "IsBadPort(22)";
  local_218._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_108 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (long **)local_218;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_110,599);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x258;
  file_01.m_begin = (iterator)&local_120;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_130,
             msg_01);
  local_a8._0_1_ = (class_property<bool>)IsBadPort(6000);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_218._0_8_ = "IsBadPort(6000)";
  local_218._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_138 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (long **)local_218;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_140,600);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x25a;
  file_02.m_begin = (iterator)&local_150;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_160,
             msg_02);
  bVar2 = IsBadPort(0x50);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_218._0_8_ = "!IsBadPort(80)";
  local_218._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_170 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_168 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (long **)local_218;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_170,0x25a);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x25b;
  file_03.m_begin = (iterator)&local_180;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_190,
             msg_03);
  bVar2 = IsBadPort(0x1bb);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_218._0_8_ = "!IsBadPort(443)";
  local_218._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_198 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (long **)local_218;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_1a0,0x25b);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x25c;
  file_04.m_begin = (iterator)&local_1b0;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1c0,
             msg_04);
  bVar2 = IsBadPort(0x208d);
  local_a8 = (undefined **)CONCAT71(local_a8._1_7_,!bVar2);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_218._0_8_ = "!IsBadPort(8333)";
  local_218._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_1c8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (long **)local_218;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_1d0,0x25c);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_1d8 = 0;
  port_00 = 0xffff;
  do {
    bVar2 = IsBadPort(port_00);
    if (bVar2) {
      local_1d8 = local_1d8 + 1;
    }
    port_00 = port_00 - 1;
  } while (port_00 != 0);
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x265;
  file_05.m_begin = (iterator)&local_1e8;
  msg_05.m_end = pvVar4;
  msg_05.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1f8,
             msg_05);
  local_218._8_8_ = local_218._8_8_ & 0xffffffffffffff00;
  local_218._0_8_ = &PTR__lazy_ostream_013abb30;
  local_208 = boost::unit_test::lazy_ostream::inst;
  local_200 = "";
  local_b0 = &local_21c;
  local_88 = &local_1d8;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_1d8 == 0x50);
  local_21c = 0x50;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_58 = "";
  local_68 = &local_88;
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb70;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  local_a0 = (element_type *)((ulong)local_a0 & 0xffffffffffffff00);
  local_a8 = &PTR__lazy_ostream_013abcf0;
  sStack_98.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_218,1,2,REQUIRE,0xeb926b,(size_t)&local_60,0x265,
             &local_80,"80",(assertion_result *)&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(isbadport)
{
    BOOST_CHECK(IsBadPort(1));
    BOOST_CHECK(IsBadPort(22));
    BOOST_CHECK(IsBadPort(6000));

    BOOST_CHECK(!IsBadPort(80));
    BOOST_CHECK(!IsBadPort(443));
    BOOST_CHECK(!IsBadPort(8333));

    // Check all ports, there must be 80 bad ports in total.
    size_t total_bad_ports{0};
    for (uint16_t port = std::numeric_limits<uint16_t>::max(); port > 0; --port) {
        if (IsBadPort(port)) {
            ++total_bad_ports;
        }
    }
    BOOST_CHECK_EQUAL(total_bad_ports, 80);
}